

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::udiv(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint numBits;
  APInt AVar5;
  WordType local_30;
  
  if (in_RDX == 0) {
    __assert_fail("RHS != 0 && \"Divide by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x621,"APInt llvm::APInt::udiv(uint64_t) const");
  }
  numBits = *(uint *)(RHS + 8);
  if (numBits < 0x41) {
    uVar3 = *(ulong *)RHS;
LAB_00182d72:
    uVar3 = uVar3 / in_RDX;
  }
  else {
    uVar2 = countLeadingZerosSlowCase((APInt *)RHS);
    uVar2 = numBits - uVar2;
    if (uVar2 != 0) {
      if (in_RDX == 1) {
        APInt(this,(APInt *)RHS);
        uVar4 = extraout_RDX_00;
        goto LAB_00182d95;
      }
      bVar1 = ult((APInt *)RHS,in_RDX);
      if (!bVar1) {
        bVar1 = operator==((APInt *)RHS,in_RDX);
        if (!bVar1) {
          numBits = *(uint *)(RHS + 8);
          uVar2 = (uint)((ulong)uVar2 + 0x3f >> 6);
          if (uVar2 != 1) {
            APInt(this,numBits,0,false);
            divide(*(WordType **)RHS,uVar2,&local_30,1,(this->U).pVal,(WordType *)0x0);
            uVar4 = extraout_RDX_01;
            goto LAB_00182d95;
          }
          uVar3 = **(ulong **)RHS;
          goto LAB_00182d72;
        }
        numBits = *(uint *)(RHS + 8);
        uVar3 = 1;
        goto LAB_00182d8e;
      }
      numBits = *(uint *)(RHS + 8);
    }
    uVar3 = 0;
  }
LAB_00182d8e:
  APInt(this,numBits,uVar3,false);
  uVar4 = extraout_RDX;
LAB_00182d95:
  AVar5._8_8_ = uVar4;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt APInt::udiv(uint64_t RHS) const {
  assert(RHS != 0 && "Divide by zero?");

  // First, deal with the easy case
  if (isSingleWord())
    return APInt(BitWidth, U.VAL / RHS);

  // Get some facts about the LHS words.
  unsigned lhsWords = getNumWords(getActiveBits());

  // Deal with some degenerate cases
  if (!lhsWords)
    // 0 / X ===> 0
    return APInt(BitWidth, 0);
  if (RHS == 1)
    // X / 1 ===> X
    return *this;
  if (this->ult(RHS))
    // X / Y ===> 0, iff X < Y
    return APInt(BitWidth, 0);
  if (*this == RHS)
    // X / X ===> 1
    return APInt(BitWidth, 1);
  if (lhsWords == 1) // rhsWords is 1 if lhsWords is 1.
    // All high words are zero, just use native divide
    return APInt(BitWidth, this->U.pVal[0] / RHS);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Quotient(BitWidth, 0); // to hold result.
  divide(U.pVal, lhsWords, &RHS, 1, Quotient.U.pVal, nullptr);
  return Quotient;
}